

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_binary_unord_op
          (CompilerMSL *this,uint32_t result_type,uint32_t result_id,uint32_t op0,uint32_t op1,
          char *op)

{
  uint32_t result_id_00;
  uint32_t result_type_00;
  bool bVar1;
  char (*in_stack_fffffffffffffef8) [2];
  bool local_e1;
  string local_e0;
  string local_c0;
  string local_90;
  string local_70;
  string local_50;
  bool local_29;
  char *pcStack_28;
  bool forward;
  char *op_local;
  uint32_t op1_local;
  uint32_t op0_local;
  uint32_t result_id_local;
  uint32_t result_type_local;
  CompilerMSL *this_local;
  
  pcStack_28 = op;
  op_local._0_4_ = op1;
  op_local._4_4_ = op0;
  op1_local = result_id;
  op0_local = result_type;
  _result_id_local = this;
  bVar1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,op0);
  local_e1 = false;
  if (bVar1) {
    local_e1 = CompilerGLSL::should_forward(&this->super_CompilerGLSL,(uint32_t)op_local);
  }
  result_type_00 = op0_local;
  result_id_00 = op1_local;
  local_29 = local_e1;
  CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
            (&local_70,&this->super_CompilerGLSL,op_local._4_4_,true);
  CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
            (&local_90,&this->super_CompilerGLSL,(uint32_t)op_local,true);
  CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
            (&local_c0,&this->super_CompilerGLSL,op_local._4_4_,true);
  CompilerGLSL::to_enclosed_unpacked_expression_abi_cxx11_
            (&local_e0,&this->super_CompilerGLSL,(uint32_t)op_local,true);
  join<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[6],std::__cxx11::string,char_const(&)[2],char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
            (&local_50,(spirv_cross *)"(isunordered(",(char (*) [14])&local_70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x6737c9,
             (char (*) [3])&local_90,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") || ",
             (char (*) [6])&local_c0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x645fd9,
             (char (*) [2])&stack0xffffffffffffffd8,(char **)0x645fd9,(char (*) [2])&local_e0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,
             in_stack_fffffffffffffef8);
  CompilerGLSL::emit_op
            (&this->super_CompilerGLSL,result_type_00,result_id_00,&local_50,(bool)(local_29 & 1),
             false);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_e0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  Compiler::inherit_expression_dependencies((Compiler *)this,op1_local,op_local._4_4_);
  Compiler::inherit_expression_dependencies((Compiler *)this,op1_local,(uint32_t)op_local);
  return;
}

Assistant:

void CompilerMSL::emit_binary_unord_op(uint32_t result_type, uint32_t result_id, uint32_t op0, uint32_t op1,
                                       const char *op)
{
	bool forward = should_forward(op0) && should_forward(op1);
	emit_op(result_type, result_id,
	        join("(isunordered(", to_enclosed_unpacked_expression(op0), ", ", to_enclosed_unpacked_expression(op1),
	             ") || ", to_enclosed_unpacked_expression(op0), " ", op, " ", to_enclosed_unpacked_expression(op1),
	             ")"),
	        forward);

	inherit_expression_dependencies(result_id, op0);
	inherit_expression_dependencies(result_id, op1);
}